

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

int __thiscall position::see_move(position *this,Move *m)

{
  pointer *this_00;
  bool bVar1;
  Piece PVar2;
  U64 UVar3;
  U64 UVar4;
  U64 UVar5;
  U64 UVar6;
  U64 UVar7;
  reference pvVar8;
  size_type sVar9;
  ulong uVar10;
  reference pvVar11;
  size_type sVar12;
  int local_26c;
  Piece local_224;
  int local_210;
  bool local_1ba;
  Piece local_190;
  int vv;
  Piece attacker;
  int av;
  Piece v;
  Piece victim;
  int prev;
  int score;
  int16 local_16a;
  SeePiece local_168;
  __normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_> local_160;
  const_iterator local_158;
  SeePiece *local_150;
  int16 local_142;
  SeePiece local_140;
  __normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_> local_138;
  const_iterator local_130;
  Color local_128;
  uint local_124;
  Color color;
  uint b;
  uint w;
  int i;
  __normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_> local_110;
  SeePiece *local_108;
  __normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_> local_100;
  int16 local_f2;
  Piece local_f0;
  SeePiece local_ec;
  Square local_e4;
  ulong uStack_e0;
  Square s_1;
  U64 black_attackers;
  SeePiece local_d0;
  Square local_c8;
  Square local_c4;
  ulong uStack_c0;
  Square s;
  U64 white_attackers;
  Color local_b0 [6];
  ulong local_98;
  U64 a;
  undefined1 local_88 [4];
  Piece atkr;
  vector<SeePiece,_std::allocator<SeePiece>_> white_list;
  vector<SeePiece,_std::allocator<SeePiece>_> black_list;
  U64 black_bb;
  U64 white_bb;
  U64 attackers;
  U64 pieces;
  Square from;
  Square to;
  Color local_28;
  Square wks;
  Move *pMStack_20;
  Square bks;
  Move *m_local;
  position *this_local;
  
  local_28 = black;
  pMStack_20 = m;
  m_local = (Move *)this;
  wks = king_square(this,&local_28);
  from = A1;
  to = king_square(this,&from);
  pieces._4_4_ = (uint)pMStack_20->t;
  pieces._0_4_ = (Square)pMStack_20->f;
  attackers = all_pieces(this);
  UVar3 = get_pieces<(Color)0>(this);
  UVar4 = pinned<(Color)0>(this);
  UVar5 = get_pieces<(Color)1>(this);
  UVar6 = pinned<(Color)1>(this);
  std::vector<SeePiece,_std::allocator<SeePiece>_>::vector
            ((vector<SeePiece,_std::allocator<SeePiece>_> *)
             &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<SeePiece,_std::allocator<SeePiece>_>::vector
            ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
  a._4_4_ = no_piece;
  do {
    UVar7 = attackers_of(this,(Square *)((long)&pieces + 4),&attackers);
    local_98 = UVar7 & attackers;
    if (local_98 == 0) {
      local_100._M_current =
           (SeePiece *)
           std::vector<SeePiece,_std::allocator<SeePiece>_>::begin
                     ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
      local_108 = (SeePiece *)
                  std::vector<SeePiece,_std::allocator<SeePiece>_>::end
                            ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
      std::
      sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>>
                (local_100,
                 (__normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_>)
                 local_108);
      this_00 = &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_110._M_current =
           (SeePiece *)
           std::vector<SeePiece,_std::allocator<SeePiece>_>::begin
                     ((vector<SeePiece,_std::allocator<SeePiece>_> *)this_00);
      _w = std::vector<SeePiece,_std::allocator<SeePiece>_>::end
                     ((vector<SeePiece,_std::allocator<SeePiece>_> *)this_00);
      std::
      sort<__gnu_cxx::__normal_iterator<SeePiece*,std::vector<SeePiece,std::allocator<SeePiece>>>>
                (local_110,
                 (__normal_iterator<SeePiece_*,_std::vector<SeePiece,_std::allocator<SeePiece>_>_>)
                 _w);
      b = 0;
      color = white;
      local_124 = 0;
      local_128 = to_move(this);
      if (local_128 == black) {
        local_138._M_current =
             (SeePiece *)
             std::vector<SeePiece,_std::allocator<SeePiece>_>::begin
                       ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                        &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::__normal_iterator<SeePiece_const*,std::vector<SeePiece,std::allocator<SeePiece>>>
        ::__normal_iterator<SeePiece*>
                  ((__normal_iterator<SeePiece_const*,std::vector<SeePiece,std::allocator<SeePiece>>>
                    *)&local_130,&local_138);
        local_142 = 0;
        SeePiece::SeePiece(&local_140,(Piece *)((long)&a + 4),&local_142);
        local_150 = (SeePiece *)
                    std::vector<SeePiece,_std::allocator<SeePiece>_>::insert
                              ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                               &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_130,
                               &local_140);
      }
      else {
        local_160._M_current =
             (SeePiece *)
             std::vector<SeePiece,_std::allocator<SeePiece>_>::begin
                       ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
        __gnu_cxx::__normal_iterator<SeePiece_const*,std::vector<SeePiece,std::allocator<SeePiece>>>
        ::__normal_iterator<SeePiece*>
                  ((__normal_iterator<SeePiece_const*,std::vector<SeePiece,std::allocator<SeePiece>>>
                    *)&local_158,&local_160);
        local_16a = 0;
        SeePiece::SeePiece(&local_168,(Piece *)((long)&a + 4),&local_16a);
        std::vector<SeePiece,_std::allocator<SeePiece>_>::insert
                  ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88,local_158,&local_168);
      }
      victim = pawn;
      goto LAB_00151422;
    }
    attackers = attackers ^ local_98;
    local_b0[2] = 0;
    local_b0[1] = 1;
    bVar1 = is_attacked(this,&to,local_b0 + 2,local_b0 + 1,attackers);
    local_1ba = true;
    if (!bVar1) {
      local_b0[0] = black;
      white_attackers._4_4_ = 0;
      local_1ba = is_attacked(this,&wks,local_b0,(Color *)((long)&white_attackers + 4),attackers);
    }
    if (local_1ba != false) {
      this_local._4_4_ = pawn;
      goto LAB_001518bb;
    }
    uStack_c0 = local_98 & (UVar3 ^ UVar4);
    if (uStack_c0 != 0) {
      while (uStack_c0 != 0) {
        local_c4 = bits::pop_lsb(&stack0xffffffffffffff40);
        if (local_c4 == (Square)pieces) {
          local_c8 = local_c4;
          a._4_4_ = piece_on(this,&local_c8);
        }
        else {
          black_attackers._4_4_ = piece_on(this,&local_c4);
          PVar2 = piece_on(this,&local_c4);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar2);
          black_attackers._2_2_ = (undefined2)*pvVar8;
          SeePiece::SeePiece(&local_d0,(Piece *)((long)&black_attackers + 4),
                             (int16 *)((long)&black_attackers + 2));
          std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                    ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88,&local_d0);
        }
      }
    }
    uStack_e0 = local_98 & (UVar5 ^ UVar6);
    if (uStack_e0 != 0) {
      while (uStack_e0 != 0) {
        local_e4 = bits::pop_lsb(&stack0xffffffffffffff20);
        if (local_e4 == (Square)pieces) {
          a._4_4_ = piece_on(this,&local_e4);
        }
        else {
          local_f0 = piece_on(this,&local_e4);
          PVar2 = piece_on(this,&local_e4);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar2);
          local_f2 = (int16)*pvVar8;
          SeePiece::SeePiece(&local_ec,&local_f0,&local_f2);
          std::vector<SeePiece,_std::allocator<SeePiece>_>::emplace_back<SeePiece>
                    ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                     &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&local_ec);
        }
      }
    }
    sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                      ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
  } while (((sVar9 != 0) ||
           (sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                              ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                               &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage), sVar9 != 0)) ||
          (a._4_4_ != no_piece));
  this_local._4_4_ = pawn;
LAB_001518bb:
  white_attackers._0_4_ = 1;
  std::vector<SeePiece,_std::allocator<SeePiece>_>::~vector
            ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
  std::vector<SeePiece,_std::allocator<SeePiece>_>::~vector
            ((vector<SeePiece,_std::allocator<SeePiece>_> *)
             &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
LAB_00151422:
  if (b == 0) {
    PVar2 = piece_on(this,(Square *)((long)&pieces + 4));
    if (PVar2 == king) {
      this_local._4_4_ = pawn;
      goto LAB_001518bb;
    }
    if (PVar2 == no_piece) {
      local_210 = 0;
    }
    else {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)PVar2);
      local_210 = *pvVar8;
    }
    victim = local_210 + victim;
    local_128 = local_128 ^ black;
    b = b + 1;
    goto LAB_00151422;
  }
  uVar10 = (ulong)color;
  sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                    ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
  if ((sVar9 <= uVar10) ||
     (uVar10 = (ulong)local_124,
     sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                       ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                        &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), sVar9 <= uVar10)) {
LAB_001518a8:
    this_local._4_4_ = victim;
    goto LAB_001518bb;
  }
  if (local_128 == white) {
    uVar10 = (ulong)local_124;
    local_124 = local_124 + 1;
    pvVar11 = std::vector<SeePiece,_std::allocator<SeePiece>_>::operator[]
                        ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                         &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,uVar10);
    local_224 = pvVar11->p;
  }
  else {
    uVar10 = (ulong)color;
    color = color + black;
    pvVar11 = std::vector<SeePiece,_std::allocator<SeePiece>_>::operator[]
                        ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88,uVar10);
    local_224 = pvVar11->p;
  }
  vv = -1;
  local_190 = no_piece;
  if ((local_128 == white) &&
     (uVar10 = (ulong)color,
     sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                       ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88), uVar10 < sVar9)) {
    pvVar11 = std::vector<SeePiece,_std::allocator<SeePiece>_>::operator[]
                        ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88,(ulong)color);
    local_190 = pvVar11->p;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)local_190);
    vv = *pvVar8;
  }
  else if ((local_128 == black) &&
          (uVar10 = (ulong)local_124,
          sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                            ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                             &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage), uVar10 < sVar9)) {
    pvVar11 = std::vector<SeePiece,_std::allocator<SeePiece>_>::operator[]
                        ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                         &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage,(ulong)local_124);
    local_190 = pvVar11->p;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)local_190);
    vv = *pvVar8;
  }
  if (local_190 == no_piece) goto LAB_001518a8;
  local_128 = local_128 ^ black;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&mvals,(ulong)local_224);
  local_26c = *pvVar8;
  if ((local_26c < vv) || (local_224 == king)) {
    if ((local_190 == king) &&
       (((local_128 == black &&
         (uVar10 = (ulong)local_124,
         sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                           ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                            &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar10 < sVar9)) ||
        ((local_128 == white &&
         (uVar10 = (ulong)color,
         sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                           ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88), uVar10 < sVar9
         )))))) {
      this_local._4_4_ = victim;
      goto LAB_001518bb;
    }
    if ((local_224 == king) &&
       (((local_128 == black &&
         (uVar10 = (ulong)color,
         sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                           ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88), uVar10 < sVar9
         )) || ((local_128 == white &&
                (uVar10 = (ulong)local_124,
                sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                                  ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                                   &white_list.
                                    super__Vector_base<SeePiece,_std::allocator<SeePiece>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage), uVar10 < sVar9))))))
    goto LAB_00151829;
    if (local_224 != king) {
      if (local_128 == black) {
        sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                          ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                           &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar12 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                           ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
        if (sVar12 < sVar9) goto LAB_00151829;
      }
      if (local_128 == white) {
        sVar9 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                          ((vector<SeePiece,_std::allocator<SeePiece>_> *)local_88);
        sVar12 = std::vector<SeePiece,_std::allocator<SeePiece>_>::size
                           ((vector<SeePiece,_std::allocator<SeePiece>_> *)
                            &white_list.super__Vector_base<SeePiece,_std::allocator<SeePiece>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar12 < sVar9) goto LAB_00151829;
      }
    }
  }
  if ((b & 1) == 1) {
    local_26c = -local_26c;
  }
  victim = local_26c + victim;
  b = b + 1;
  goto LAB_00151422;
LAB_00151829:
  this_local._4_4_ = victim;
  goto LAB_001518bb;
}

Assistant:

int position::see_move(const Move& m) const {

	Square bks = king_square(black);
	Square wks = king_square(white);
	Square to = Square(m.t);
	Square from = Square(m.f);
	U64 pieces = all_pieces();
	U64 attackers = 0ULL;

	U64 white_bb = get_pieces<white>() ^ pinned<white>();
	U64 black_bb = get_pieces<black>() ^ pinned<black>();

	std::vector<SeePiece> black_list;
	std::vector<SeePiece> white_list;
	Piece atkr = Piece::no_piece;

	while (true) { // while loop for pieces behind currently attacking pieces
		U64 a = attackers_of(to, pieces) & pieces;
		if (a) {
			pieces ^= a;

			if (is_attacked(wks, white, black, pieces) || is_attacked(bks, black, white, pieces))
			{
				return 0; // let search handle discovered checking sequences
			}

			attackers |= a;
		}
		else break;

		U64 white_attackers = a & white_bb;
		if (white_attackers) {
			while (white_attackers) {
				Square s = Square(bits::pop_lsb(white_attackers));
				if (s == from) {
					atkr = piece_on(Square(s));
					continue; // first attacker is handled below
				}
				white_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		U64 black_attackers = a & black_bb;
		if (black_attackers) {
			while (black_attackers) {
				Square s = Square(bits::pop_lsb(black_attackers));
				if (s == from) {
					atkr = piece_on(s);
					continue;
				}
				black_list.emplace_back(SeePiece(piece_on(s), mvals[piece_on(s)]));
			}
		}

		if (white_list.size() == 0 && black_list.size() == 0 && atkr == Piece::no_piece) return 0;
	}

	std::sort(white_list.begin(), white_list.end());
	std::sort(black_list.begin(), black_list.end());


	int i = 0;
	unsigned w = 0;
	unsigned b = 0;
	Color color = to_move();


	if (color == black) { black_list.insert(black_list.begin(), SeePiece(atkr, 0)); }
	else { white_list.insert(white_list.begin(), SeePiece(atkr, 0)); }

	int score = 0;
	int prev = score;

	while (true) {

		Piece victim = Piece::no_piece;
		if (i == 0) {
			Piece v = piece_on(to);
			if (v == Piece::king) return 0; // illegal
			score += (v == Piece::no_piece ? 0 : mvals[v]);
			color = Color(color ^ 1);
			prev = score;
			++i;
			continue;
		}

		if ((w >= white_list.size() || b >= black_list.size())) break;

		victim = (color == white ? black_list[b++].p : white_list[w++].p);

		int av = -1;
		Piece attacker = Piece::no_piece;
		if (color == white && w < white_list.size()) {
			attacker = white_list[w].p;
			av = mvals[attacker];
		}
		else if (color == black && b < black_list.size()) {
			attacker = black_list[b].p;
			av = mvals[attacker];
		}

		if (attacker == Piece::no_piece) break;


		color = Color(color ^ 1);
		int vv = mvals[victim];



		if (vv < av || victim == king) {
			if (attacker == king) {
				if ((color == black && b < black_list.size()) ||
					(color == white && w < white_list.size())) {
					return score; // illegal
				}
			}


			if ((victim == king && ((color == black && w < white_list.size()) || (color == white && b < black_list.size()))) ||
				(victim != king && ((color == black && (black_list.size() > white_list.size())) ||
					(color == white && (white_list.size() > black_list.size()))))) {
				score = prev;
				return score;
			}
		}
		score += ((i & 1) == 1 ? -vv : vv);
		++i;
		prev = score;
	}

	return score;
}